

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyfiledialogs.c
# Opt level: O3

int dirExists(char *aDirPath)

{
  DIR *__dirp;
  int iVar1;
  
  iVar1 = 0;
  if ((aDirPath != (char *)0x0) && (iVar1 = 0, *aDirPath != '\0')) {
    __dirp = opendir(aDirPath);
    if (__dirp != (DIR *)0x0) {
      closedir(__dirp);
      iVar1 = 1;
    }
  }
  return iVar1;
}

Assistant:

static int dirExists( char const * const aDirPath )
{
        DIR * lDir ;
        if ( ! aDirPath || ! strlen( aDirPath ) )
                return 0 ;
        lDir = opendir( aDirPath ) ;
        if ( ! lDir )
        {
                return 0 ;
        }
        closedir( lDir ) ;
        return 1 ;
}